

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Sphere(X3DImporter *this)

{
  FIReader *pFVar1;
  CX3DImporter_NodeElement *pCVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  CX3DImporter_NodeElement_Geometry3D *this_00;
  string *psVar6;
  uint pAttrIdx;
  pointer v;
  aiVector3t<float> aVar7;
  bool local_b9;
  CX3DImporter_NodeElement *ne;
  allocator<char> local_ad;
  float local_ac;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist;
  string an;
  string def;
  string use;
  
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  pAttrIdx = 0;
  ne = (CX3DImporter_NodeElement *)0x0;
  use.field_2._M_local_buf[0] = '\0';
  def.field_2._M_local_buf[0] = '\0';
  uVar4 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  local_ac = 1.0;
  local_b9 = true;
  do {
    if (uVar4 == pAttrIdx) {
      if (use._M_string_length == 0) {
        tlist.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tlist.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        tlist.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_00 = (CX3DImporter_NodeElement_Geometry3D *)operator_new(0x78);
        CX3DImporter_NodeElement_Geometry3D::CX3DImporter_NodeElement_Geometry3D
                  (this_00,ENET_Sphere,this->NodeElement_Cur);
        ne = (CX3DImporter_NodeElement *)this_00;
        if (def._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&(this_00->super_CX3DImporter_NodeElement).ID);
        }
        StandardShapes::MakeSphere(3,&tlist);
        for (v = tlist.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; pCVar2 = ne,
            v != tlist.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish; v = v + 1) {
          aVar7 = ::operator*(v,local_ac);
          an._M_string_length._0_4_ = aVar7.z;
          an._M_dataplus._M_p = aVar7._0_8_;
          std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)(pCVar2 + 1),
                     (value_type *)&an);
        }
        ne[1].ID.field_2._M_local_buf[0] = local_b9;
        ne[1].ID._M_string_length = 3;
        iVar5 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
        pCVar2 = ne;
        if ((char)iVar5 == '\0') {
          std::__cxx11::string::string<std::allocator<char>>((string *)&an,"Sphere",&local_ad);
          ParseNode_Metadata(this,pCVar2,&an);
          std::__cxx11::string::~string((string *)&an);
        }
        else {
          std::__cxx11::
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::push_back
                    (&this->NodeElement_Cur->Child,&ne);
        }
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_List,&ne);
        std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                  (&tlist.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                  );
      }
      else {
        XML_CheckNode_MustBeEmpty(this);
        if (def._M_string_length != 0) {
          Throw_DEF_And_USE(this);
        }
        bVar3 = FindNodeElement(this,&use,ENET_Sphere,&ne);
        if (!bVar3) {
          Throw_USE_NotFound(this,&use);
        }
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_Cur->Child,&ne);
      }
      std::__cxx11::string::~string((string *)&def);
      std::__cxx11::string::~string((string *)&use);
      return;
    }
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar5 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,(ulong)pAttrIdx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&an,(char *)CONCAT44(extraout_var,iVar5),(allocator<char> *)&tlist);
    bVar3 = std::operator==(&an,"DEF");
    if (bVar3) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                (pFVar1,(ulong)pAttrIdx);
      psVar6 = &def;
LAB_005a86eb:
      std::__cxx11::string::assign((char *)psVar6);
    }
    else {
      bVar3 = std::operator==(&an,"USE");
      if (bVar3) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,(ulong)pAttrIdx);
        psVar6 = &use;
        goto LAB_005a86eb;
      }
      bVar3 = std::operator==(&an,"bboxCenter");
      if (!bVar3) {
        bVar3 = std::operator==(&an,"bboxSize");
        if (!bVar3) {
          bVar3 = std::operator==(&an,"containerField");
          if (!bVar3) {
            bVar3 = std::operator==(&an,"radius");
            if (bVar3) {
              local_ac = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
            }
            else {
              bVar3 = std::operator==(&an,"solid");
              if (bVar3) {
                local_b9 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
              }
              else {
                Throw_IncorrectAttr(this,&an);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&an);
    pAttrIdx = pAttrIdx + 1;
  } while( true );
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Sphere()
{
    std::string use, def;
    ai_real radius = 1;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Sphere, ne);
	}
	else
	{
		const unsigned int tess = 3;///TODO: IME tessellation factor through ai_property

		std::vector<aiVector3D> tlist;

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry3D(CX3DImporter_NodeElement::ENET_Sphere, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		StandardShapes::MakeSphere(tess, tlist);
		// copy data from temp array and apply scale
		for(std::vector<aiVector3D>::iterator it = tlist.begin(); it != tlist.end(); ++it)
		{
			((CX3DImporter_NodeElement_Geometry3D*)ne)->Vertices.push_back(*it * radius);
		}

		((CX3DImporter_NodeElement_Geometry3D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry3D*)ne)->NumIndices = 3;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Sphere");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}